

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseActionResult(JSONParser *this)

{
  Result RVar1;
  Enum EVar2;
  TypeVector expected;
  
  RVar1 = ExpectKey(this,"expected");
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    expected.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    expected.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    expected.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar1 = ParseTypeVector(this,&expected);
    EVar2 = (Enum)(RVar1.enum_ == Error);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              (&expected.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>);
  }
  return (Result)EVar2;
}

Assistant:

wabt::Result JSONParser::ParseActionResult() {
  // Not needed for wabt-interp, but useful for other parsers.
  EXPECT_KEY("expected");
  TypeVector expected;
  CHECK_RESULT(ParseTypeVector(&expected));
  return wabt::Result::Ok;
}